

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O1

void __thiscall
btHashedOverlappingPairCache::cleanProxyFromPairs
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy,btDispatcher *dispatcher)

{
  CleanPairCallback cleanPairs;
  undefined **local_20;
  btBroadphaseProxy *local_18;
  btHashedOverlappingPairCache *local_10;
  btDispatcher *local_8;
  
  local_20 = &PTR__btOverlapCallback_002233d8;
  local_18 = proxy;
  local_10 = this;
  local_8 = dispatcher;
  (*(this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
    _vptr_btOverlappingPairCallback[0xc])(this,&local_20);
  return;
}

Assistant:

void	btHashedOverlappingPairCache::cleanProxyFromPairs(btBroadphaseProxy* proxy,btDispatcher* dispatcher)
{

	class	CleanPairCallback : public btOverlapCallback
	{
		btBroadphaseProxy* m_cleanProxy;
		btOverlappingPairCache*	m_pairCache;
		btDispatcher* m_dispatcher;

	public:
		CleanPairCallback(btBroadphaseProxy* cleanProxy,btOverlappingPairCache* pairCache,btDispatcher* dispatcher)
			:m_cleanProxy(cleanProxy),
			m_pairCache(pairCache),
			m_dispatcher(dispatcher)
		{
		}
		virtual	bool	processOverlap(btBroadphasePair& pair)
		{
			if ((pair.m_pProxy0 == m_cleanProxy) ||
				(pair.m_pProxy1 == m_cleanProxy))
			{
				m_pairCache->cleanOverlappingPair(pair,m_dispatcher);
			}
			return false;
		}
		
	};

	CleanPairCallback cleanPairs(proxy,this,dispatcher);

	processAllOverlappingPairs(&cleanPairs,dispatcher);

}